

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O1

void __thiscall r_exec::TPX::TPX(TPX *this,AutoFocusController *auto_focus,_Fact *target)

{
  atomic_int_fast64_t *paVar1;
  Code *pCVar2;
  _Object *p_Var3;
  BindingMap *pBVar4;
  BindingMap *this_00;
  Code *pCVar5;
  
  (this->super__Object).refCount.super___atomic_base<long>._M_i = 0;
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__TPX_001c0bf0;
  this->auto_focus = auto_focus;
  (this->target).object = (_Object *)0x0;
  (this->target_bindings).object = (_Object *)0x0;
  (this->abstracted_target).object = (_Object *)0x0;
  (this->cst_hook).object = (_Object *)0x0;
  (this->new_maps).
  super__Vector_base<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->new_maps).
  super__Vector_base<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->new_maps).
  super__Vector_base<core::P<r_exec::BindingMap>,_std::allocator<core::P<r_exec::BindingMap>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (BindingMap *)operator_new(0x38);
  BindingMap::BindingMap(this_00);
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  pCVar5 = BindingMap::abstract_object(this_00,(Code *)target,false);
  pCVar2 = (Code *)(this->abstracted_target).object;
  if (pCVar2 != pCVar5) {
    if (pCVar2 != (Code *)0x0) {
      LOCK();
      paVar1 = &(pCVar2->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pCVar2->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pCVar2->super__Object)._vptr__Object[1])();
      }
    }
    (this->abstracted_target).object = &pCVar5->super__Object;
    if (pCVar5 != (Code *)0x0) {
      LOCK();
      paVar1 = &(pCVar5->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  p_Var3 = (this->target).object;
  if (p_Var3 != (_Object *)target) {
    if (p_Var3 != (_Object *)0x0) {
      LOCK();
      (p_Var3->refCount).super___atomic_base<long>._M_i =
           (p_Var3->refCount).super___atomic_base<long>._M_i + -1;
      UNLOCK();
      if ((p_Var3->refCount).super___atomic_base<long>._M_i < 1) {
        (*(((LObject *)&p_Var3->_vptr__Object)->super_Object<r_code::LObject,_r_exec::LObject>).
          super_LObject.super_Code.super__Object._vptr__Object[1])();
      }
    }
    (this->target).object = (_Object *)target;
    if (target != (_Fact *)0x0) {
      LOCK();
      paVar1 = &(target->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject
                .super_Code.super__Object.refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
      UNLOCK();
    }
  }
  pBVar4 = (BindingMap *)(this->target_bindings).object;
  if (pBVar4 != this_00) {
    if (pBVar4 != (BindingMap *)0x0) {
      LOCK();
      paVar1 = &(pBVar4->super__Object).refCount;
      (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
      UNLOCK();
      if ((pBVar4->super__Object).refCount.super___atomic_base<long>._M_i < 1) {
        (*(pBVar4->super__Object)._vptr__Object[1])();
      }
    }
    (this->target_bindings).object = (_Object *)this_00;
    LOCK();
    paVar1 = &(this_00->super__Object).refCount;
    (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
    UNLOCK();
  }
  LOCK();
  paVar1 = &(this_00->super__Object).refCount;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + -1;
  UNLOCK();
  if (0 < (this_00->super__Object).refCount.super___atomic_base<long>._M_i) {
    return;
  }
  (*(this_00->super__Object)._vptr__Object[1])(this_00);
  return;
}

Assistant:

TPX::TPX(AutoFocusController *auto_focus, _Fact *target): _Object(), auto_focus(auto_focus)   // called by CTPX's ctor.
{
    P<BindingMap> bm = new BindingMap();
    abstracted_target = (_Fact *)bm->abstract_object(target, false);
    this->target = target;
    target_bindings = bm;
}